

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConvexDecomposition.cpp
# Opt level: O1

bool __thiscall
chrono::collision::ChConvexDecompositionHACD::GetConvexHullResult
          (ChConvexDecompositionHACD *this,uint hullIndex,ChTriangleMesh *convextrimesh)

{
  ulong uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong numCH;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  size_t *psVar9;
  size_t *psVar10;
  Vec3<double> *points;
  ulong uVar11;
  double local_78;
  double dStack_70;
  size_t local_68;
  double local_60;
  double dStack_58;
  size_t local_50;
  double local_48;
  double dStack_40;
  size_t local_38;
  
  numCH = (ulong)hullIndex;
  uVar1 = this->myHACD->m_nClusters;
  if (numCH <= uVar1) {
    sVar5 = HACD::HACD::GetNPointsCH(this->myHACD,numCH);
    sVar6 = HACD::HACD::GetNTrianglesCH(this->myHACD,numCH);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = sVar6;
    uVar7 = SUB168(auVar3 * ZEXT816(0x18),0);
    uVar11 = uVar7 + 8;
    if (0xfffffffffffffff7 < uVar7) {
      uVar11 = 0xffffffffffffffff;
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = sVar5;
    uVar7 = SUB168(auVar4 * ZEXT816(0x18),0);
    if (SUB168(auVar3 * ZEXT816(0x18),8) != 0) {
      uVar11 = 0xffffffffffffffff;
    }
    uVar8 = uVar7 + 8;
    if (0xfffffffffffffff7 < uVar7) {
      uVar8 = 0xffffffffffffffff;
    }
    uVar7 = 0xffffffffffffffff;
    if (SUB168(auVar4 * ZEXT816(0x18),8) == 0) {
      uVar7 = uVar8;
    }
    psVar9 = (size_t *)operator_new__(uVar7);
    *psVar9 = sVar5;
    points = (Vec3<double> *)(psVar9 + 1);
    psVar10 = (size_t *)operator_new__(uVar11);
    *psVar10 = sVar6;
    HACD::HACD::GetCH(this->myHACD,numCH,points,(Vec3<long> *)(psVar10 + 1));
    if (sVar6 != 0) {
      uVar7 = 0;
      uVar11 = 1;
      do {
        uVar8 = (ulong)(uint)((Vec3<long> *)(psVar10 + 1))[uVar7].m_data[0];
        local_48 = points[uVar8].m_data[0];
        dStack_40 = points[uVar8].m_data[1];
        local_38 = psVar9[uVar8 * 3 + 3];
        local_60 = points[(uint)psVar10[uVar7 * 3 + 2]].m_data[0];
        dStack_58 = points[(uint)psVar10[uVar7 * 3 + 2]].m_data[1];
        local_50 = psVar9[(ulong)(uint)psVar10[uVar7 * 3 + 2] * 3 + 3];
        local_78 = points[(uint)psVar10[uVar7 * 3 + 3]].m_data[0];
        dStack_70 = points[(uint)psVar10[uVar7 * 3 + 3]].m_data[1];
        local_68 = psVar9[(ulong)(uint)psVar10[uVar7 * 3 + 3] * 3 + 3];
        (*(convextrimesh->super_ChGeometry)._vptr_ChGeometry[0xb])
                  (convextrimesh,&local_48,&local_60,&local_78);
        bVar2 = uVar11 < sVar6;
        uVar7 = uVar11;
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (bVar2);
    }
    operator_delete__(psVar9,*psVar9 * 0x18 + 8);
    operator_delete__(psVar10,*psVar10 * 0x18 + 8);
  }
  return numCH <= uVar1;
}

Assistant:

bool ChConvexDecompositionHACD::GetConvexHullResult(unsigned int hullIndex, geometry::ChTriangleMesh& convextrimesh) {
    if (hullIndex > myHACD->GetNClusters())
        return false;

    size_t nPoints = myHACD->GetNPointsCH(hullIndex);
    size_t nTriangles = myHACD->GetNTrianglesCH(hullIndex);

    HACD::Vec3<HACD::Real>* pointsCH = new HACD::Vec3<HACD::Real>[nPoints];
    HACD::Vec3<long>* trianglesCH = new HACD::Vec3<long>[nTriangles];
    myHACD->GetCH(hullIndex, pointsCH, trianglesCH);

    for (unsigned int i = 0; i < nTriangles; i++) {
        unsigned int i1 = trianglesCH[i].X();
        unsigned int i2 = trianglesCH[i].Y();
        unsigned int i3 = trianglesCH[i].Z();
        convextrimesh.addTriangle(ChVector<>(pointsCH[i1].X(), pointsCH[i1].Y(), pointsCH[i1].Z()),
                                  ChVector<>(pointsCH[i2].X(), pointsCH[i2].Y(), pointsCH[i2].Z()),
                                  ChVector<>(pointsCH[i3].X(), pointsCH[i3].Y(), pointsCH[i3].Z()));
    }

    delete[] pointsCH;
    delete[] trianglesCH;

    return true;
}